

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

void __thiscall flatbuffers::FlatCompiler::ValidateOptions(FlatCompiler *this,FlatCOptions *options)

{
  allocator<char> local_31;
  string local_30;
  
  if ((options->filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (options->filenames).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"missing input files",&local_31);
    (*(this->params_).error_fn)(this,&local_30,false,true);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((options->opts).proto_mode == true) {
    if (options->any_generator == false) goto LAB_00225b79;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"cannot generate code directly from .proto files",&local_31);
    (*(this->params_).error_fn)(this,&local_30,true,true);
  }
  else {
    if (((options->any_generator != false) || ((options->conform_to_schema)._M_string_length != 0))
       || ((options->annotate_schema)._M_string_length != 0)) goto LAB_00225b79;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"no options: specify at least one generator.",&local_31);
    (*(this->params_).error_fn)(this,&local_30,true,true);
  }
  std::__cxx11::string::~string((string *)&local_30);
LAB_00225b79:
  if (((options->opts).cs_gen_json_serializer == true) &&
     ((options->opts).generate_object_based_api == false)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "--cs-gen-json-serializer requires --gen-object-api to be set as well.",&local_31);
    (*(this->params_).error_fn)(this,&local_30,true,true);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void FlatCompiler::ValidateOptions(const FlatCOptions &options) {
  const IDLOptions &opts = options.opts;

  if (!options.filenames.size()) Error("missing input files", false, true);

  if (opts.proto_mode) {
    if (options.any_generator)
      Error("cannot generate code directly from .proto files", true);
  } else if (!options.any_generator && options.conform_to_schema.empty() &&
             options.annotate_schema.empty()) {
    Error("no options: specify at least one generator.", true);
  }

  if (opts.cs_gen_json_serializer && !opts.generate_object_based_api) {
    Error(
        "--cs-gen-json-serializer requires --gen-object-api to be set as "
        "well.");
  }
}